

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O1

bool absl::lts_20250127::StrContainsIgnoreCase(string_view haystack,string_view needle)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  string_view piece1;
  string_view piece1_00;
  
  piece1._M_str = haystack._M_str;
  uVar3 = haystack._M_len;
  uVar2 = needle._M_len;
  bVar4 = uVar2 <= uVar3;
  if (bVar4) {
    piece1._M_len = uVar2;
    bVar1 = EqualsIgnoreCase(piece1,needle);
    while (!bVar1) {
      uVar3 = uVar3 - 1;
      piece1._M_str = piece1._M_str + 1;
      bVar4 = uVar3 >= uVar2;
      if (uVar3 < uVar2) {
        return bVar4;
      }
      piece1_00._M_str = piece1._M_str;
      piece1_00._M_len = uVar2;
      bVar1 = EqualsIgnoreCase(piece1_00,needle);
    }
  }
  return bVar4;
}

Assistant:

bool StrContainsIgnoreCase(absl::string_view haystack,
                           absl::string_view needle) noexcept {
  while (haystack.size() >= needle.size()) {
    if (StartsWithIgnoreCase(haystack, needle)) return true;
    haystack.remove_prefix(1);
  }
  return false;
}